

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_object.cpp
# Opt level: O2

void Object::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  undefined4 *puVar1;
  code *pcVar2;
  long lVar3;
  
  if (_c == IndexOfMethod) {
    puVar1 = (undefined4 *)*_a;
    pcVar2 = *_a[1];
    lVar3 = *(long *)((long)_a[1] + 8);
    if (pcVar2 == noArgSignal && lVar3 == 0) {
      *puVar1 = 0;
      return;
    }
    if (pcVar2 == oneArgSignal && lVar3 == 0) {
      *puVar1 = 1;
      return;
    }
    if (pcVar2 == twoArgsSignal && lVar3 == 0) {
      *puVar1 = 2;
    }
  }
  else if (_c == InvokeMetaMethod) {
    if (_id == 2) {
      twoArgsSignal((Object *)_o,*_a[1],(QString *)_a[2]);
      return;
    }
    if (_id == 1) {
      oneArgSignal((Object *)_o,(QString *)_a[1]);
      return;
    }
    if (_id == 0) {
      noArgSignal((Object *)_o);
      return;
    }
  }
  return;
}

Assistant:

void Object::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<Object *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->noArgSignal(); break;
        case 1: _t->oneArgSignal((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 2: _t->twoArgsSignal((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[2]))); break;
        default: ;
        }
    } else if (_c == QMetaObject::IndexOfMethod) {
        int *result = reinterpret_cast<int *>(_a[0]);
        {
            using _t = void (Object::*)();
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&Object::noArgSignal)) {
                *result = 0;
                return;
            }
        }
        {
            using _t = void (Object::*)(const QString & );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&Object::oneArgSignal)) {
                *result = 1;
                return;
            }
        }
        {
            using _t = void (Object::*)(int , const QString & );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&Object::twoArgsSignal)) {
                *result = 2;
                return;
            }
        }
    }
}